

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkRwtSet(N_Vector y,N_Vector weight,void *data)

{
  N_Vector My;
  int iVar1;
  
  if (*(int *)((long)data + 0x220) == 0) {
    My = *(N_Vector *)((long)data + 0x248);
    if (*(code **)((long)data + 0x208) == (code *)0x0) {
      N_VScale(0x3ff0000000000000,y,My);
    }
    else {
      iVar1 = (**(code **)((long)data + 0x208))(data,y,My);
      if (iVar1 != 0) {
        return -0x12;
      }
    }
    if (*(int *)((long)data + 0x1c) == 1) {
      iVar1 = arkRwtSetSV((ARKodeMem)data,My,weight);
      return iVar1;
    }
    if (*(int *)((long)data + 0x1c) == 0) {
      iVar1 = arkRwtSetSS((ARKodeMem)data,My,weight);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int arkRwtSet(N_Vector y, N_Vector weight, void* data)
{
  ARKodeMem ark_mem;
  N_Vector My;
  int flag = 0;

  /* data points to ark_mem here */
  ark_mem = (ARKodeMem)data;

  /* return if rwt is just ewt */
  if (ark_mem->rwt_is_ewt) { return (0); }

  /* put M*y into ark_tempv1 */
  My = ark_mem->tempv1;
  if (ark_mem->step_mmult != NULL)
  {
    flag = ark_mem->step_mmult((void*)ark_mem, y, My);
    if (flag != ARK_SUCCESS) { return (ARK_MASSMULT_FAIL); }
  }
  else
  { /* this condition should not apply, but just in case */
    N_VScale(ONE, y, My);
  }

  /* call appropriate routine to fill rwt */
  switch (ark_mem->ritol)
  {
  case ARK_SS: flag = arkRwtSetSS(ark_mem, My, weight); break;
  case ARK_SV: flag = arkRwtSetSV(ark_mem, My, weight); break;
  }

  return (flag);
}